

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void assertion_fail(string_view file,int line,string_view func,string_view assertion)

{
  char *__ptr;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  int *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffd8;
  
  tinyformat::
  format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_ffffffffffffffd8,in_RSI,in_RDI,in_R8,in_RCX);
  __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    (in_stack_ffffffffffffff88);
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (in_stack_ffffffffffffff88);
  fwrite(__ptr,1,__n,_stderr);
  abort();
}

Assistant:

void assertion_fail(std::string_view file, int line, std::string_view func, std::string_view assertion)
{
    auto str = strprintf("%s:%s %s: Assertion `%s' failed.\n", file, line, func, assertion);
    fwrite(str.data(), 1, str.size(), stderr);
    std::abort();
}